

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageloader.cpp
# Opt level: O2

Function *
stackjit::AssemblyImageLoader::loadFunctionDefinition
          (Function *__return_storage_ptr__,BinaryData *data,size_t *index)

{
  bool isExternal;
  bool bVar1;
  unsigned_long uVar2;
  bool *pbVar3;
  string *psVar4;
  size_t *index_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  bool bVar5;
  string returnType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parameters;
  string memberFunctionName;
  string className;
  string name;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  size_t *local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  isExternal = anon_unknown_4::loadData<bool>(data,index);
  bVar1 = anon_unknown_4::loadData<bool>(data,index);
  index_00 = (size_t *)local_80;
  local_88 = 0;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_80[0] = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_d0.field_2._M_local_buf[0] = '\0';
  local_90 = index_00;
  if (bVar1) {
    (anonymous_namespace)::loadString_abi_cxx11_
              (&local_118,(_anonymous_namespace_ *)data,(BinaryData *)index,index_00);
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    (anonymous_namespace)::loadString_abi_cxx11_
              (&local_118,(_anonymous_namespace_ *)data,(BinaryData *)index,index_00);
    std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::operator+(&local_f8,&local_b0,"::");
    std::operator+(&local_118,&local_f8,&local_d0);
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    this = &local_f8;
  }
  else {
    (anonymous_namespace)::loadString_abi_cxx11_
              (&local_118,(_anonymous_namespace_ *)data,(BinaryData *)index,index_00);
    this = &local_118;
    std::__cxx11::string::operator=((string *)&local_90,(string *)this);
  }
  std::__cxx11::string::~string((string *)this);
  uVar2 = anon_unknown_4::loadData<unsigned_long>(data,index);
  local_f8._M_dataplus._M_p = (pointer)0x0;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_allocated_capacity = 0;
  while (bVar5 = uVar2 != 0, uVar2 = uVar2 - 1, bVar5) {
    (anonymous_namespace)::loadString_abi_cxx11_
              (&local_118,(_anonymous_namespace_ *)data,(BinaryData *)index,index_00);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
               &local_118);
    std::__cxx11::string::~string((string *)&local_118);
  }
  (anonymous_namespace)::loadString_abi_cxx11_
            (&local_118,(_anonymous_namespace_ *)data,(BinaryData *)index,index_00);
  std::__cxx11::string::string((string *)&local_50,(string *)&local_90);
  std::__cxx11::string::string((string *)&local_70,(string *)&local_118);
  Loader::Function::Function
            (__return_storage_ptr__,&local_50,&local_70,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_f8,isExternal);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pbVar3 = Loader::Function::isMemberFunction(__return_storage_ptr__);
  *pbVar3 = bVar1;
  psVar4 = Loader::Function::className_abi_cxx11_(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)psVar4);
  psVar4 = Loader::Function::memberFunctionName_abi_cxx11_(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)psVar4);
  std::__cxx11::string::~string((string *)&local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

Loader::Function AssemblyImageLoader::loadFunctionDefinition(BinaryData& data, std::size_t& index) {
		auto isExternal = loadData<bool>(data, index);
		auto isMemberFunction = loadData<bool>(data, index);

		std::string name;
		std::string className;
		std::string memberFunctionName;
		if (isMemberFunction) {
			className = loadString(data, index);
			memberFunctionName = loadString(data, index);
			name = className + "::" + memberFunctionName;
		} else {
			name = loadString(data, index);
		}

		auto numParameters = loadData<std::size_t>(data, index);
		std::vector<std::string> parameters;
		for (std::size_t i = 0; i < numParameters; i++) {
			parameters.push_back(loadString(data, index));
		}

		auto returnType = loadString(data, index);

		Loader::Function function(name, returnType, parameters, isExternal);
		function.isMemberFunction() = isMemberFunction;
		function.className() = className;
		function.memberFunctionName() = memberFunctionName;
		return function;
	}